

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O1

int __thiscall AddrManImpl::CheckAddrman(AddrManImpl *this)

{
  key_type *__k;
  unordered_map<CService,_long,_CServiceHash,_std::equal_to<CService>,_std::allocator<std::pair<const_CService,_long>_>_>
  *this_00;
  nid_type *pnVar1;
  pointer plVar2;
  string prefix;
  string end_msg;
  bool bVar3;
  Network NVar4;
  uint uVar5;
  uint *puVar6;
  const_iterator cVar7;
  ulong uVar8;
  size_type sVar9;
  __node_base_ptr p_Var10;
  size_type sVar11;
  mapped_type *pmVar12;
  uchar *puVar13;
  mapped_type *pmVar14;
  __node_base *p_Var15;
  ulong uVar16;
  int iVar17;
  nid_type (*panVar18) [64];
  _Hash_node_base *p_Var19;
  unsigned_long *in_R9;
  AddrManImpl *pAVar20;
  __node_base *p_Var21;
  long in_FS_OFFSET;
  bool bVar22;
  byte bVar23;
  nid_type n;
  unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
  local_counts;
  unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
  mapNew;
  unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> setTried;
  Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> logging_timer2;
  undefined8 in_stack_fffffffffffffe48;
  AddrManImpl *pAVar24;
  undefined8 in_stack_fffffffffffffe50;
  int *fmt;
  uint256 *nKey;
  undefined1 in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe59;
  undefined8 in_stack_fffffffffffffe60;
  int *args;
  nid_type (*panVar25) [64];
  undefined8 in_stack_fffffffffffffe68;
  _Hashtable<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_01;
  key_type in_stack_fffffffffffffe70;
  _Hash_node_base _Var26;
  __buckets_ptr in_stack_fffffffffffffe78;
  size_type in_stack_fffffffffffffe80;
  _Hashtable<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_150;
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_118;
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_e0;
  string local_d8;
  long *local_b8 [2];
  long local_a8 [2];
  Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> local_98;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"CheckAddrman","");
  fmt = &this->nNew;
  args = &this->nTried;
  local_118._M_buckets =
       (__buckets_ptr)
       ((long)(this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start >> 3);
  tinyformat::format<int,int,unsigned_long>
            (&local_d8,(tinyformat *)"new %i, tried %i, total %u",(char *)fmt,args,(int *)&local_118
             ,in_R9);
  prefix._M_string_length = in_stack_fffffffffffffe50;
  prefix._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe48;
  prefix.field_2._M_local_buf[0] = in_stack_fffffffffffffe58;
  prefix.field_2._M_allocated_capacity._1_7_ = in_stack_fffffffffffffe59;
  prefix.field_2._8_8_ = in_stack_fffffffffffffe60;
  end_msg._M_string_length = in_stack_fffffffffffffe70;
  end_msg._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe68;
  end_msg.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffe78;
  end_msg.field_2._8_8_ = in_stack_fffffffffffffe80;
  BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::Timer
            (&local_98,prefix,end_msg,(LogFlags)local_b8,SUB81(&local_d8,0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_b8[0] != local_a8) {
    operator_delete(local_b8[0],local_a8[0] + 1);
  }
  local_118._M_buckets = &local_118._M_single_bucket;
  local_118._M_bucket_count = 1;
  local_118._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_118._M_element_count = 0;
  local_118._M_rehash_policy._M_max_load_factor = 1.0;
  local_118._M_rehash_policy._M_next_resize = 0;
  local_118._M_single_bucket = (__node_base_ptr)0x0;
  local_150._M_buckets = &local_150._M_single_bucket;
  local_150._M_bucket_count = 1;
  local_150._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_150._M_element_count = 0;
  local_150._M_rehash_policy._M_max_load_factor = 1.0;
  local_150._M_rehash_policy._M_next_resize = 0;
  local_150._M_single_bucket = (__node_base_ptr)0x0;
  iVar17 = -7;
  if ((long)(this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_start >> 3 == (long)this->nNew + (long)this->nTried) {
    this_01 = &(this->mapInfo)._M_h;
    p_Var21 = &(this->mapInfo)._M_h._M_before_begin;
    this_00 = &this->mapAddr;
    pAVar24 = this;
    do {
      p_Var21 = p_Var21->_M_nxt;
      if (p_Var21 == (__node_base *)0x0) {
        this = (AddrManImpl *)((ulong)this & 0xffffffff);
        break;
      }
      _Var26._M_nxt = p_Var21[1]._M_nxt;
      __k = (key_type *)(p_Var21 + 2);
      if (*(char *)&p_Var21[0x11]._M_nxt == '\x01') {
        if (p_Var21[0xf]._M_nxt == (_Hash_node_base *)0x0) {
          pAVar20 = (AddrManImpl *)0xffffffff;
          goto LAB_00444000;
        }
        if (*(int *)((long)&p_Var21[0x10]._M_nxt + 4) != 0) {
          pAVar20 = (AddrManImpl *)0xfffffffe;
          goto LAB_00444000;
        }
        local_e0 = &local_118;
        std::
        _Hashtable<long,long,std::allocator<long>,std::__detail::_Identity,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<long,false>>>>
                  ((_Hashtable<long,long,std::allocator<long>,std::__detail::_Identity,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_e0,&stack0xfffffffffffffe70,&local_e0);
        NVar4 = CNetAddr::GetNetwork((CNetAddr *)__k);
        local_e0 = (_Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)CONCAT44(local_e0._4_4_,NVar4);
        pmVar14 = std::__detail::
                  _Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&stack0xfffffffffffffe78,(key_type *)&local_e0);
        pmVar14->n_tried = pmVar14->n_tried + 1;
LAB_00443f87:
        cVar7 = std::
                _Hashtable<CService,_std::pair<const_CService,_long>,_std::allocator<std::pair<const_CService,_long>_>,_std::__detail::_Select1st,_std::equal_to<CService>,_CServiceHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&this_00->_M_h,__k);
        pAVar20 = (AddrManImpl *)0xfffffffb;
        if ((cVar7.super__Node_iterator_base<std::pair<const_CService,_long>,_false>._M_cur ==
             (__node_type *)0x0) ||
           (*(_Hash_node_base **)
             ((long)cVar7.super__Node_iterator_base<std::pair<const_CService,_long>,_false>._M_cur +
             0x30) != _Var26._M_nxt)) goto LAB_00444000;
        uVar8 = (ulong)*(int *)((long)&p_Var21[0x11]._M_nxt + 4);
        pAVar20 = (AddrManImpl *)0xfffffff2;
        if (((long)uVar8 < 0) ||
           ((plVar2 = (pAVar24->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
            (ulong)((long)(pAVar24->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl
                          .super__Vector_impl_data._M_finish - (long)plVar2 >> 3) <= uVar8 ||
            ((_Hash_node_base *)plVar2[uVar8] != _Var26._M_nxt)))) goto LAB_00444000;
        if ((long)p_Var21[9]._M_nxt < 0) {
          pAVar20 = (AddrManImpl *)0xfffffffa;
          goto LAB_00444000;
        }
        bVar22 = -1 < (long)p_Var21[0xf]._M_nxt;
        uVar5 = (uint)this;
        if (!bVar22) {
          uVar5 = 0xfffffff8;
        }
        this = (AddrManImpl *)(ulong)uVar5;
      }
      else {
        uVar5 = *(uint *)((long)&p_Var21[0x10]._M_nxt + 4);
        if (uVar5 < 9) {
          if (uVar5 != 0) {
            puVar6 = (uint *)std::__detail::
                             _Map_base<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             ::operator[]((_Map_base<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                           *)&local_150,(key_type *)&stack0xfffffffffffffe70);
            *puVar6 = uVar5;
            NVar4 = CNetAddr::GetNetwork((CNetAddr *)__k);
            local_e0 = (_Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)CONCAT44(local_e0._4_4_,NVar4);
            pmVar14 = std::__detail::
                      _Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&stack0xfffffffffffffe78,(key_type *)&local_e0);
            pmVar14->n_new = pmVar14->n_new + 1;
            goto LAB_00443f87;
          }
          pAVar20 = (AddrManImpl *)0xfffffffc;
        }
        else {
          pAVar20 = (AddrManImpl *)0xfffffffd;
        }
LAB_00444000:
        this = pAVar20;
        bVar22 = false;
      }
    } while (bVar22);
    iVar17 = (int)this;
    if (((p_Var21 == (__node_base *)0x0) && (iVar17 = -9, local_118._M_element_count == (long)*args)
        ) && (iVar17 = -10, local_150._M_element_count == (long)*fmt)) {
      panVar18 = pAVar24->vvTried;
      nKey = &pAVar24->nKey;
      uVar8 = 0;
      bVar23 = false;
      do {
        uVar16 = 0;
        bVar22 = false;
        panVar25 = panVar18;
        do {
          if ((*panVar18)[0] != -1) {
            sVar9 = std::
                    _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    ::count(&local_118,*panVar18);
            if (sVar9 == 0) {
              this = (AddrManImpl *)0xfffffff5;
              break;
            }
            p_Var10 = std::
                      _Hashtable<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::_M_find_before_node
                                (this_01,(ulong)(*panVar18)[0] %
                                         (pAVar24->mapInfo)._M_h._M_bucket_count,*panVar18,
                                 (*panVar18)[0]);
            if (p_Var10 == (__node_base_ptr)0x0) {
              p_Var19 = (_Hash_node_base *)0x0;
            }
            else {
              p_Var19 = p_Var10->_M_nxt;
            }
            if (p_Var19 == (_Hash_node_base *)0x0) {
LAB_00444135:
              bVar3 = false;
              this = (AddrManImpl *)0xffffffef;
            }
            else {
              uVar5 = AddrInfo::GetTriedBucket
                                ((AddrInfo *)(p_Var19 + 2),nKey,pAVar24->m_netgroupman);
              if (uVar8 != uVar5) goto LAB_00444135;
              uVar5 = AddrInfo::GetBucketPosition((AddrInfo *)(p_Var19 + 2),nKey,false,(int)uVar8);
              if (uVar16 == uVar5) {
                bVar3 = true;
                std::
                _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::_M_erase(&local_118,panVar18);
              }
              else {
                this = (AddrManImpl *)0xffffffee;
                bVar3 = false;
              }
            }
            if (!bVar3) break;
          }
          bVar22 = 0x3e < uVar16;
          uVar16 = uVar16 + 1;
          panVar18 = (nid_type (*) [64])(*panVar18 + 1);
        } while (uVar16 != 0x40);
        iVar17 = (int)this;
        if (!bVar22) break;
        bVar23 = 0xfe < uVar8;
        uVar8 = uVar8 + 1;
        panVar18 = panVar25 + 1;
      } while (uVar8 != 0x100);
      if ((bVar23 & 1) != 0) {
        panVar18 = pAVar24->vvNew;
        uVar8 = 0;
        bVar23 = false;
        do {
          uVar16 = 0;
          bVar22 = false;
          panVar25 = panVar18;
          do {
            if ((*panVar18)[0] != -1) {
              sVar11 = std::
                       _Hashtable<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::count(&local_150,*panVar18);
              if (sVar11 == 0) {
                this = (AddrManImpl *)0xfffffff4;
                break;
              }
              p_Var10 = std::
                        _Hashtable<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        ::_M_find_before_node
                                  (this_01,(ulong)(*panVar18)[0] %
                                           (pAVar24->mapInfo)._M_h._M_bucket_count,*panVar18,
                                   (*panVar18)[0]);
              if (p_Var10 == (__node_base_ptr)0x0) {
                p_Var19 = (_Hash_node_base *)0x0;
              }
              else {
                p_Var19 = p_Var10->_M_nxt;
              }
              if ((p_Var19 == (_Hash_node_base *)0x0) ||
                 (uVar5 = AddrInfo::GetBucketPosition
                                    ((AddrInfo *)(p_Var19 + 2),nKey,true,(int)uVar8),
                 uVar16 != uVar5)) {
                bVar3 = false;
                this = (AddrManImpl *)0xffffffed;
              }
              else {
                pmVar12 = std::__detail::
                          _Map_base<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[]((_Map_base<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                        *)&local_150,*panVar18);
                *pmVar12 = *pmVar12 + -1;
                bVar3 = true;
                if (*pmVar12 == 0) {
                  std::
                  _Hashtable<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::_M_erase(&local_150,panVar18);
                }
              }
              if (!bVar3) break;
            }
            bVar22 = 0x3e < uVar16;
            uVar16 = uVar16 + 1;
            panVar18 = (nid_type (*) [64])(*panVar18 + 1);
          } while (uVar16 != 0x40);
          iVar17 = (int)this;
          if (!bVar22) break;
          bVar23 = 0x3fe < uVar8;
          uVar8 = uVar8 + 1;
          panVar18 = panVar25 + 1;
        } while (uVar8 != 0x400);
        if ((((bVar23 & 1) != 0) && (iVar17 = -0xd, local_118._M_element_count == 0)) &&
           (iVar17 = -0xf, local_150._M_element_count == 0)) {
          pnVar1 = &pAVar24->nIdCount;
          puVar13 = std::
                    __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                              (nKey,pnVar1);
          if ((nid_type *)puVar13 == pnVar1) {
            iVar17 = -0x10;
          }
          else {
            p_Var15 = &(pAVar24->m_network_counts)._M_h._M_before_begin;
            do {
              p_Var15 = p_Var15->_M_nxt;
              if (p_Var15 == (__node_base *)0x0) {
                iVar17 = 0;
                break;
              }
              pmVar14 = std::__detail::
                        _Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)&stack0xfffffffffffffe78,(key_type *)(p_Var15 + 1));
              if ((_Hash_node_base *)pmVar14->n_new ==
                  *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var15 + 2))->_M_max_load_factor)
              {
                pmVar14 = std::__detail::
                          _Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[]((_Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                        *)&stack0xfffffffffffffe78,(key_type *)(p_Var15 + 1));
                bVar22 = (_Hash_node_base *)pmVar14->n_tried == p_Var15[3]._M_nxt;
                if (!bVar22) {
                  this = (AddrManImpl *)0xffffffeb;
                }
              }
              else {
                this = (AddrManImpl *)0xffffffeb;
                bVar22 = false;
              }
              iVar17 = (int)this;
            } while (bVar22);
          }
        }
      }
    }
  }
  std::
  _Hashtable<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&stack0xfffffffffffffe78);
  std::
  _Hashtable<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_150);
  std::
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_118);
  BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::~Timer(&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar17;
  }
  __stack_chk_fail();
}

Assistant:

int AddrManImpl::CheckAddrman() const
{
    AssertLockHeld(cs);

    LOG_TIME_MILLIS_WITH_CATEGORY_MSG_ONCE(
        strprintf("new %i, tried %i, total %u", nNew, nTried, vRandom.size()), BCLog::ADDRMAN);

    std::unordered_set<nid_type> setTried;
    std::unordered_map<nid_type, int> mapNew;
    std::unordered_map<Network, NewTriedCount> local_counts;

    if (vRandom.size() != (size_t)(nTried + nNew))
        return -7;

    for (const auto& entry : mapInfo) {
        nid_type n = entry.first;
        const AddrInfo& info = entry.second;
        if (info.fInTried) {
            if (!TicksSinceEpoch<std::chrono::seconds>(info.m_last_success)) {
                return -1;
            }
            if (info.nRefCount)
                return -2;
            setTried.insert(n);
            local_counts[info.GetNetwork()].n_tried++;
        } else {
            if (info.nRefCount < 0 || info.nRefCount > ADDRMAN_NEW_BUCKETS_PER_ADDRESS)
                return -3;
            if (!info.nRefCount)
                return -4;
            mapNew[n] = info.nRefCount;
            local_counts[info.GetNetwork()].n_new++;
        }
        const auto it{mapAddr.find(info)};
        if (it == mapAddr.end() || it->second != n) {
            return -5;
        }
        if (info.nRandomPos < 0 || (size_t)info.nRandomPos >= vRandom.size() || vRandom[info.nRandomPos] != n)
            return -14;
        if (info.m_last_try < NodeSeconds{0s}) {
            return -6;
        }
        if (info.m_last_success < NodeSeconds{0s}) {
            return -8;
        }
    }

    if (setTried.size() != (size_t)nTried)
        return -9;
    if (mapNew.size() != (size_t)nNew)
        return -10;

    for (int n = 0; n < ADDRMAN_TRIED_BUCKET_COUNT; n++) {
        for (int i = 0; i < ADDRMAN_BUCKET_SIZE; i++) {
            if (vvTried[n][i] != -1) {
                if (!setTried.count(vvTried[n][i]))
                    return -11;
                const auto it{mapInfo.find(vvTried[n][i])};
                if (it == mapInfo.end() || it->second.GetTriedBucket(nKey, m_netgroupman) != n) {
                    return -17;
                }
                if (it->second.GetBucketPosition(nKey, false, n) != i) {
                    return -18;
                }
                setTried.erase(vvTried[n][i]);
            }
        }
    }

    for (int n = 0; n < ADDRMAN_NEW_BUCKET_COUNT; n++) {
        for (int i = 0; i < ADDRMAN_BUCKET_SIZE; i++) {
            if (vvNew[n][i] != -1) {
                if (!mapNew.count(vvNew[n][i]))
                    return -12;
                const auto it{mapInfo.find(vvNew[n][i])};
                if (it == mapInfo.end() || it->second.GetBucketPosition(nKey, true, n) != i) {
                    return -19;
                }
                if (--mapNew[vvNew[n][i]] == 0)
                    mapNew.erase(vvNew[n][i]);
            }
        }
    }

    if (setTried.size())
        return -13;
    if (mapNew.size())
        return -15;
    if (nKey.IsNull())
        return -16;

    // It's possible that m_network_counts may have all-zero entries that local_counts
    // doesn't have if addrs from a network were being added and then removed again in the past.
    if (m_network_counts.size() < local_counts.size()) {
        return -20;
    }
    for (const auto& [net, count] : m_network_counts) {
        if (local_counts[net].n_new != count.n_new || local_counts[net].n_tried != count.n_tried) {
            return -21;
        }
    }

    return 0;
}